

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O3

void soplex::
     updateScale<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *vecnnzeroes,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *resnvec,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *tmpvec,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               **psccurr,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               **pscprev,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *qcurr,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *qprev,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eprev1,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *eprev2,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *epsilon)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  bool bVar19;
  fpclass_type fVar20;
  undefined8 uVar21;
  int32_t iVar22;
  int iVar23;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar24;
  cpp_dec_float<50U,_int,_void> *pcVar25;
  byte bVar26;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  cpp_dec_float<50U,_int,_void> local_168;
  undefined1 local_128 [16];
  uint local_118 [3];
  undefined3 uStack_10b;
  uint local_108 [3];
  bool local_fc;
  undefined8 local_f8;
  cpp_dec_float<50U,_int,_void> local_e8;
  undefined1 local_a8 [16];
  undefined1 local_98 [13];
  undefined3 uStack_8b;
  undefined1 auStack_88 [13];
  undefined8 local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_168.fpclass = cpp_dec_float_finite;
  local_168.prec_elem = 10;
  local_168.data._M_elems[0] = 0;
  local_168.data._M_elems[1] = 0;
  local_168.data._M_elems[2] = 0;
  local_168.data._M_elems[3] = 0;
  local_168.data._M_elems[4] = 0;
  local_168.data._M_elems[5] = 0;
  local_168.data._M_elems[6] = 0;
  local_168.data._M_elems[7] = 0;
  local_168.data._M_elems[8] = 0;
  local_168.data._M_elems[9] = 0;
  local_168.exp = 0;
  local_168.neg = false;
  pcVar25 = &eprev1->m_backend;
  if ((&local_168 != &eprev2->m_backend) &&
     (pcVar25 = &eprev2->m_backend, &local_168 != &eprev1->m_backend)) {
    uVar1 = *(undefined8 *)((eprev1->m_backend).data._M_elems + 8);
    local_168.data._M_elems[8] = (uint)uVar1;
    local_168.data._M_elems[9] = (uint)((ulong)uVar1 >> 0x20);
    uVar1 = *(undefined8 *)(eprev1->m_backend).data._M_elems;
    uVar5 = *(undefined8 *)((eprev1->m_backend).data._M_elems + 2);
    uVar6 = *(undefined8 *)((eprev1->m_backend).data._M_elems + 4);
    uVar7 = *(undefined8 *)((eprev1->m_backend).data._M_elems + 6);
    local_168.data._M_elems[4] = (uint)uVar6;
    local_168.data._M_elems[5] = (uint)((ulong)uVar6 >> 0x20);
    local_168.data._M_elems[6] = (uint)uVar7;
    local_168.data._M_elems[7] = (uint)((ulong)uVar7 >> 0x20);
    local_168.data._M_elems[0] = (uint)uVar1;
    local_168.data._M_elems[1] = (uint)((ulong)uVar1 >> 0x20);
    local_168.data._M_elems[2] = (uint)uVar5;
    local_168.data._M_elems[3] = (uint)((ulong)uVar5 >> 0x20);
    local_168.exp = (eprev1->m_backend).exp;
    local_168.neg = (eprev1->m_backend).neg;
    local_168.fpclass = (eprev1->m_backend).fpclass;
    local_168.prec_elem = (eprev1->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_168,pcVar25);
  uVar21 = local_168._48_8_;
  bVar19 = local_168.neg;
  iVar18 = local_168.exp;
  uVar17 = local_168.data._M_elems[9];
  uVar16 = local_168.data._M_elems[8];
  uVar15 = local_168.data._M_elems[7];
  uVar14 = local_168.data._M_elems[6];
  uVar13 = local_168.data._M_elems[5];
  uVar12 = local_168.data._M_elems[4];
  uVar11 = local_168.data._M_elems[3];
  uVar10 = local_168.data._M_elems[2];
  uVar9 = local_168.data._M_elems[1];
  uVar8 = local_168.data._M_elems[0];
  uVar1._4_4_ = local_168.data._M_elems[2];
  uVar1._0_4_ = local_168.data._M_elems[1];
  uVar5._4_4_ = local_168.data._M_elems[4];
  uVar5._0_4_ = local_168.data._M_elems[3];
  uVar6._4_4_ = local_168.data._M_elems[6];
  uVar6._0_4_ = local_168.data._M_elems[5];
  uVar7._4_4_ = local_168.data._M_elems[8];
  uVar7._0_4_ = local_168.data._M_elems[7];
  fVar20 = local_168.fpclass;
  iVar22 = local_168.prec_elem;
  bVar3 = local_168.data._M_elems[0] != 0;
  bVar4 = local_168.fpclass != cpp_dec_float_finite;
  bVar2 = bVar3 || bVar4;
  bVar26 = local_168.neg ^ bVar2;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator-=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,*psccurr);
  local_e8.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
  local_e8.data._M_elems._8_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
  local_e8.data._M_elems._16_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
  local_e8.data._M_elems._24_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
  local_e8.data._M_elems._32_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
  local_e8.exp = (epsilon->m_backend).exp;
  local_e8.neg = (epsilon->m_backend).neg;
  local_e8.fpclass = (epsilon->m_backend).fpclass;
  local_e8.prec_elem = (epsilon->m_backend).prec_elem;
  local_168.neg = (bool)bVar26;
  if (bVar19 != bVar2 && (bVar3 || bVar4)) {
    local_168.neg = (bool)(bVar26 ^ 1);
  }
  local_168.data._M_elems[0] = uVar8;
  local_168.data._M_elems[1] = uVar9;
  local_168.data._M_elems[2] = uVar10;
  local_168.data._M_elems[3] = uVar11;
  local_168.data._M_elems[4] = uVar12;
  local_168.data._M_elems[5] = uVar13;
  local_168.data._M_elems[6] = uVar14;
  local_168.data._M_elems[7] = uVar15;
  local_168.data._M_elems[8] = uVar16;
  local_168.data._M_elems[9] = uVar17;
  local_168.exp = iVar18;
  local_168._48_8_ = uVar21;
  if ((local_e8.fpclass == cpp_dec_float_NaN || fVar20 == cpp_dec_float_NaN) ||
     (iVar23 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_168,&local_e8), 0 < iVar23)) {
    local_68.m_backend.data._M_elems[0] = uVar8;
    local_68.m_backend.data._M_elems[9] = uVar17;
    local_68.m_backend.exp = iVar18;
    local_68.m_backend.fpclass = fVar20;
    local_68.m_backend.prec_elem = iVar22;
    local_68.m_backend.data._M_elems._4_8_ = uVar1;
    local_68.m_backend.data._M_elems._12_8_ = uVar5;
    local_68.m_backend.data._M_elems._20_8_ = uVar6;
    local_68.m_backend.data._M_elems._28_8_ = uVar7;
    local_68.m_backend.neg = (bool)bVar26;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)*pscprev,&local_68);
  }
  else {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(*pscprev);
  }
  pSVar24 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::
            assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        *)tmpvec,resnvec,vecnnzeroes);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator+=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,pSVar24);
  local_f8._0_4_ = cpp_dec_float_finite;
  local_f8._4_4_ = 10;
  local_128 = (undefined1  [16])0x0;
  local_118[0] = 0;
  local_118[1] = 0;
  stack0xfffffffffffffef0 = 0;
  uStack_10b = 0;
  local_108[0] = 0;
  local_108[1] = 0;
  local_108[2] = 0;
  local_fc = false;
  pcVar25 = &qcurr->m_backend;
  if (((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *)local_128 != qprev) &&
     (pcVar25 = &qprev->m_backend,
     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      *)local_128 != qcurr)) {
    local_108._0_8_ = *(undefined8 *)((qcurr->m_backend).data._M_elems + 8);
    local_128 = *(undefined1 (*) [16])(qcurr->m_backend).data._M_elems;
    local_118._0_8_ = *(undefined8 *)((qcurr->m_backend).data._M_elems + 4);
    uVar1 = *(undefined8 *)((qcurr->m_backend).data._M_elems + 6);
    stack0xfffffffffffffef0 = (undefined5)uVar1;
    uStack_10b = (undefined3)((ulong)uVar1 >> 0x28);
    local_108[2] = (qcurr->m_backend).exp;
    local_fc = (qcurr->m_backend).neg;
    local_f8._0_4_ = (qcurr->m_backend).fpclass;
    local_f8._4_4_ = (qcurr->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            ((cpp_dec_float<50U,_int,_void> *)local_128,pcVar25);
  local_78._0_4_ = cpp_dec_float_finite;
  local_78._4_4_ = 10;
  local_a8 = (undefined1  [16])0x0;
  local_98 = SUB1613((undefined1  [16])0x0,0);
  uStack_8b = 0;
  auStack_88 = SUB1613((undefined1  [16])0x0,3);
  local_168.fpclass = cpp_dec_float_finite;
  local_168.prec_elem = 10;
  local_168.data._M_elems[0] = 0;
  local_168.data._M_elems[1] = 0;
  local_168.data._M_elems[2] = 0;
  local_168.data._M_elems[3] = 0;
  local_168.data._M_elems[4] = 0;
  local_168.data._M_elems[5] = 0;
  local_168.data._M_elems[6] = 0;
  local_168.data._M_elems[7] = 0;
  local_168.data._M_elems[8] = 0;
  local_168.data._M_elems[9] = 0;
  local_168.exp = 0;
  local_168.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_168,1.0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)local_a8,&local_168,
             (cpp_dec_float<50U,_int,_void> *)local_128);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_a8);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator+=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,*psccurr);
  pSVar24 = *psccurr;
  *psccurr = *pscprev;
  *pscprev = pSVar24;
  return;
}

Assistant:

static void updateScale(
   const SSVectorBase<R> vecnnzeroes,
   const SSVectorBase<R> resnvec,
   SSVectorBase<R>& tmpvec,
   SSVectorBase<R>*& psccurr,
   SSVectorBase<R>*& pscprev,
   R qcurr,
   R qprev,
   R eprev1,
   R eprev2,
   R epsilon)
{
   assert(psccurr != nullptr);
   assert(pscprev != nullptr);
   assert(qcurr * qprev != 0.0);

   R fac = -(eprev1 * eprev2);

   SSVectorBase<R>* pssv;

   *pscprev -= *psccurr;

   if(isZero(fac, epsilon))
      (*pscprev).clear();
   else
      *pscprev *= fac;

   *pscprev += tmpvec.assignPWproduct4setup(resnvec, vecnnzeroes);

   *pscprev *= 1.0 / (qcurr * qprev);
   *pscprev += *psccurr;

   /* swap pointers */
   pssv = psccurr;
   psccurr = pscprev;
   pscprev = pssv;
}